

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_open(void)

{
  undefined1 local_44 [8];
  termios options;
  
  if (TTY_Fd < 0) {
    TTY_Fd = open(TTY_Dev,2);
    if (TTY_Fd < 0) {
      error("TTY: tty_open");
    }
    else {
      tcgetattr(TTY_Fd,(termios *)local_44);
      local_44._0_4_ = local_44._0_4_ & 0xffffca01 | 1;
      local_44._4_4_ = local_44._4_4_ & 0xfffffffe;
      options.c_oflag = options.c_oflag & 0xffff7e04;
      options.c_iflag = options.c_iflag & 0xfffffecf | 0xb0;
      options.c_lflag._3_1_ = 1;
      options.c_lflag._2_1_ = 0;
      tcsetattr(TTY_Fd,0,(termios *)local_44);
      LispReadFds.__fds_bits[TTY_Fd / 0x40] =
           1L << ((byte)((long)TTY_Fd % 0x40) & 0x3f) | LispReadFds.__fds_bits[TTY_Fd / 0x40];
    }
  }
  return;
}

Assistant:

void tty_open(void)
{
  struct termios options;

  if (TTY_Fd < 0) {
    if ((TTY_Fd = open(TTY_Dev, O_RDWR)) >= 0) {
      tcgetattr(TTY_Fd, &options);
#ifndef MAIKO_OS_HAIKU
      options.c_iflag &= ~(IMAXBEL|IXOFF|INPCK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON|IGNPAR);
#else
      options.c_iflag &= ~(IXOFF|INPCK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON|IGNPAR);
#endif
      options.c_iflag |= IGNBRK;
      options.c_oflag &= ~OPOST;
      options.c_lflag &= ~(ECHO|ECHOE|ECHOK|ECHONL|ICANON|ISIG|IEXTEN|NOFLSH|TOSTOP);
      options.c_cflag &= ~(CSIZE|PARENB);
      options.c_cflag |= CS8|CREAD;
      options.c_cc[VMIN] = 1;
      options.c_cc[VTIME] = 0;
      tcsetattr(TTY_Fd, TCSANOW, &options);

      FD_SET(TTY_Fd, &LispReadFds);
#ifdef TTYINT
      int_io_open(TTY_Fd);
#endif

    } else {
      error("TTY: tty_open");
    }
  }
}